

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

bool __thiscall
cmLocalGenerator::AppendLWYUFlags
          (cmLocalGenerator *this,string *flags,cmGeneratorTarget *target,string *lang)

{
  pointer *__return_storage_ptr__;
  cmGeneratorTarget *pcVar1;
  bool bVar2;
  byte bVar3;
  TargetType TVar4;
  cmMakefile *this_00;
  string *__args;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pvVar5;
  bool local_c9;
  bool local_c2;
  undefined1 local_a8 [8];
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  lwyuOpts;
  string *lwyuFlag;
  allocator<char> local_51;
  string local_50;
  byte local_29;
  string *psStack_28;
  bool useLWYU;
  string *lang_local;
  cmGeneratorTarget *target_local;
  string *flags_local;
  cmLocalGenerator *this_local;
  
  psStack_28 = lang;
  lang_local = (string *)target;
  target_local = (cmGeneratorTarget *)flags;
  flags_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"LINK_WHAT_YOU_USE",&local_51);
  bVar2 = cmGeneratorTarget::GetPropertyAsBool(target,&local_50);
  local_c2 = false;
  if (bVar2) {
    TVar4 = cmGeneratorTarget::GetType((cmGeneratorTarget *)lang_local);
    local_c9 = true;
    if (TVar4 != EXECUTABLE) {
      TVar4 = cmGeneratorTarget::GetType((cmGeneratorTarget *)lang_local);
      local_c9 = true;
      if (TVar4 != SHARED_LIBRARY) {
        TVar4 = cmGeneratorTarget::GetType((cmGeneratorTarget *)lang_local);
        local_c9 = TVar4 == MODULE_LIBRARY;
      }
    }
    local_c2 = local_c9;
  }
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  local_29 = local_c2;
  if (local_c2 != false) {
    this_00 = GetMakefile(this);
    __return_storage_ptr__ =
         &lwyuOpts.
          super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage;
    cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[24]>
              ((string *)__return_storage_ptr__,(char (*) [7])0xfecd37,psStack_28,
               (char (*) [24])"_LINK_WHAT_YOU_USE_FLAG");
    __args = cmMakefile::GetSafeDefinition(this_00,(string *)__return_storage_ptr__);
    std::__cxx11::string::~string
              ((string *)
               &lwyuOpts.
                super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    bVar3 = std::__cxx11::string::empty();
    local_29 = (bVar3 ^ 0xff) & 1;
    if (local_29 != 0) {
      std::
      vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::vector((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_a8);
      std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
      emplace_back<std::__cxx11::string_const&>
                ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                 local_a8,__args);
      pcVar1 = target_local;
      pvVar5 = cmGeneratorTarget::ResolveLinkerWrapper
                         ((cmGeneratorTarget *)lang_local,
                          (vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_a8,psStack_28,false);
      (*(this->super_cmOutputConverter)._vptr_cmOutputConverter[8])(this,pcVar1,pvVar5);
      std::
      vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_a8);
    }
  }
  return (bool)(local_29 & 1);
}

Assistant:

bool cmLocalGenerator::AppendLWYUFlags(std::string& flags,
                                       const cmGeneratorTarget* target,
                                       const std::string& lang)
{
  auto useLWYU = target->GetPropertyAsBool("LINK_WHAT_YOU_USE") &&
    (target->GetType() == cmStateEnums::TargetType::EXECUTABLE ||
     target->GetType() == cmStateEnums::TargetType::SHARED_LIBRARY ||
     target->GetType() == cmStateEnums::TargetType::MODULE_LIBRARY);

  if (useLWYU) {
    const auto& lwyuFlag = this->GetMakefile()->GetSafeDefinition(
      cmStrCat("CMAKE_", lang, "_LINK_WHAT_YOU_USE_FLAG"));
    useLWYU = !lwyuFlag.empty();

    if (useLWYU) {
      std::vector<BT<std::string>> lwyuOpts;
      lwyuOpts.emplace_back(lwyuFlag);
      this->AppendFlags(flags, target->ResolveLinkerWrapper(lwyuOpts, lang));
    }
  }

  return useLWYU;
}